

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rough_conductor.hpp
# Opt level: O0

Color __thiscall
RoughConductorBRDF::sample_f
          (RoughConductorBRDF *this,Color *albedo,vec3f *wo,vec3f *wi,float *pdf,Sampler *sampler)

{
  vec3f wm_00;
  vec3f v;
  vec3f *in_RCX;
  vec3f *in_RDX;
  undefined8 in_RSI;
  vec3f *in_RDI;
  float *in_R8;
  long *in_R9;
  float fVar1;
  float fVar2;
  double dVar3;
  vec3f vVar4;
  Color CVar5;
  float in_stack_00000040;
  float in_stack_00000044;
  float in_stack_00000048;
  vec3f in_stack_0000005c;
  vec3f wm;
  vec2f u;
  vec3f *a;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 local_158;
  float in_stack_fffffffffffffeac;
  undefined4 uVar6;
  undefined8 in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffef0;
  undefined8 local_c8;
  float local_c0;
  vec3f local_88 [4];
  vec3f local_58;
  undefined8 local_48;
  float *local_38;
  vec3f *local_30;
  vec3f *local_28;
  undefined8 local_20;
  vec3f local_c;
  
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_48 = (**(code **)(*in_R9 + 8))();
  vVar4 = schuttejoe::GgxVndf(in_stack_0000005c,in_stack_00000048,in_stack_00000044,
                              in_stack_00000040);
  local_88[0].z = vVar4.z;
  local_58.z = local_88[0].z;
  local_88[0]._0_8_ = vVar4._0_8_;
  local_58.x = local_88[0].x;
  local_58.y = local_88[0].y;
  a = &local_58;
  dot(a,local_28);
  ::operator*(SUB84(in_RDI,0),a);
  vVar4 = ::operator-((vec3f *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_RDI)
  ;
  local_c0 = vVar4.z;
  local_c8 = vVar4._0_8_;
  local_30->z = local_c0;
  local_30->x = (float)(undefined4)local_c8;
  local_30->y = (float)local_c8._4_4_;
  v.z = in_stack_fffffffffffffef0;
  v.x = (float)(int)in_stack_fffffffffffffee8;
  v.y = (float)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  wm_00.y = (float)in_stack_fffffffffffffed0;
  wm_00.x = (float)in_stack_fffffffffffffecc;
  wm_00.z = in_stack_fffffffffffffed4;
  fVar1 = EDX::Smith_G1(v,wm_00,in_stack_fffffffffffffeb8);
  vVar4.y = (float)(int)in_stack_fffffffffffffeb0;
  vVar4.z = (float)(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  vVar4.x = in_stack_fffffffffffffeac;
  fVar2 = EDX::GGX_D(vVar4,SUB84(in_RDI,0));
  local_158 = SUB84((double)(fVar1 * fVar2),0);
  uVar6 = (undefined4)((ulong)(double)(fVar1 * fVar2) >> 0x20);
  fVar1 = dot(local_28,&local_58);
  dVar3 = (double)CONCAT44(uVar6,local_158) * ABS((double)fVar1);
  fVar1 = dot(local_30,&local_58);
  *local_38 = (float)(dVar3 / (ABS((double)fVar1) * 4.0 * ABS((double)local_28->z)));
  if ((local_30->z <= 0.0 && local_30->z != 0.0) == (local_28->z <= 0.0 && local_28->z != 0.0)) {
    CVar5 = (Color)(**(code **)(*(long *)in_RDI + 8))(in_RDI,local_20,local_28,local_30);
  }
  else {
    vec3f::vec3f(&local_c,0.0);
    CVar5.z = local_c.z;
    CVar5.x = local_c.x;
    CVar5.y = local_c.y;
  }
  return CVar5;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, Sampler& sampler) const override
	{
		vec2f u = sampler.get2f();
    	vec3f wm = schuttejoe::GgxVndf(wo, alpha, u.x, u.y);
		wi = 2*dot(wm,wo)*wm-wo;
		// http://jcgt.org/published/0007/04/01/paper.pdf Eric Heitz
		pdf = EDX::Smith_G1(wi, wm, alpha) * EDX::GGX_D(wm,alpha) * fabs(dot(wo,wm)) / (4 * fabs(dot(wi, wm)) * fabs(wo.z));
    	if (wi.z<0 ^ wo.z<0) return 0;
    	return f(albedo, wo, wi);
	}